

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O2

void Vec_PtrFreeData(Vec_Ptr_t *p)

{
  void *__ptr;
  int i;
  
  if (p != (Vec_Ptr_t *)0x0) {
    for (i = 0; i < p->nSize; i = i + 1) {
      __ptr = Vec_PtrEntry(p,i);
      if ((void *)0x2 < __ptr) {
        free(__ptr);
      }
    }
  }
  return;
}

Assistant:

static inline void Vec_PtrFreeData( Vec_Ptr_t * p )
{
    void * pTemp; int i;
    if ( p == NULL ) return;
    Vec_PtrForEachEntry( void *, p, pTemp, i )
        if ( pTemp != (void *)(ABC_PTRINT_T)1 && pTemp != (void *)(ABC_PTRINT_T)2 )
            ABC_FREE( pTemp );
}